

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledNewScObjArray_Impl<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>,false>
          (InterpreterStackFrame *this,
          OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout,
          AuxArray<unsigned_int> *spreadIndices)

{
  byte bVar1;
  unsigned_short localRegisterID;
  ProfileId profileId;
  ProfileId arrayProfileId;
  ScriptContext *scriptContext;
  ScriptFunction *caller;
  long lVar2;
  uint localRegisterID_00;
  InterpreterStackFrame *pIVar3;
  Type spreadIndices_00;
  uint uVar4;
  ThreadContext *this_00;
  ulong __n;
  Var pvVar5;
  Type __s;
  undefined8 uStack_120;
  Var local_118;
  uint local_10c;
  Var local_108;
  uint local_fc;
  InterpreterStackFrame *local_f8;
  Arguments local_f0;
  Arguments local_e0;
  Arguments local_d0;
  ulong local_c0;
  size_t outArgsSize;
  Var stackArgs [8];
  CallInfo CStack_68;
  uint STACK_ARGS_ALLOCA_THRESHOLD;
  undefined1 local_60 [8];
  Arguments outArgs;
  CallInfo CStack_38;
  uint32 spreadSize;
  undefined1 local_30 [8];
  Arguments args;
  AuxArray<unsigned_int> *spreadIndices_local;
  OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  __s = (Type)&local_118;
  local_f8 = this;
  args.Values = (Type)spreadIndices;
  if (((byte)this[0xd6] >> 4 & 1) == 0) {
    uStack_120 = 0xf6b265;
    OP_NewScObjArray_Impl<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>,false>
              (this,playout,spreadIndices);
  }
  else {
    uStack_120 = 0xf6b27f;
    CallInfo::CallInfo(&stack0xffffffffffffffc8,CallFlags_New,(uint)playout->ArgCount);
    uStack_120 = 0xf6b297;
    Arguments::Arguments((Arguments *)local_30,CStack_38,*(Var **)(local_f8 + 0x28));
    if (args.Values == (Type)0x0) {
      local_10c = (uint)playout->Return;
      uStack_120 = 0xf6b4ab;
      local_118 = GetReg<unsigned_short>(local_f8,playout->Function);
      uStack_120 = 0xf6b4c2;
      Arguments::Arguments(&local_f0,(Arguments *)local_30);
      uStack_120 = 0xf6b4f7;
      pvVar5 = ProfilingHelpers::ProfiledNewScObjArray
                         (local_118,&local_f0,*(ScriptFunction **)(local_f8 + 0x80),
                          *(ProfileId *)(playout + 1),*(ProfileId *)((long)&playout[1].Return + 1));
      uStack_120 = 0xf6b50c;
      SetReg<unsigned_int>(local_f8,local_10c,pvVar5);
    }
    else {
      uStack_120 = 0xf6b2b6;
      Arguments::Arguments((Arguments *)&outArgs.Values,(Arguments *)local_30);
      uStack_120 = 0xf6b2ce;
      uVar4 = JavascriptFunction::GetSpreadSize
                        ((Arguments *)&outArgs.Values,(AuxArray<unsigned_int> *)args.Values,
                         *(ScriptContext **)(local_f8 + 0x78));
      uStack_120 = 0xf6b2e1;
      CallInfo::CallInfo(&stack0xffffffffffffff98,CallFlags_New,0);
      uStack_120 = 0xf6b2f2;
      Arguments::Arguments((Arguments *)local_60,CStack_68,(Var *)0x0);
      local_60 = (undefined1  [8])((ulong)local_60 & 0xffffffffff000000 | (ulong)uVar4 & 0xffffff);
      local_c0 = 0;
      if ((local_60._0_4_ & 0xffffff) < 9) {
        outArgs.Info = (Type)&outArgsSize;
        local_c0 = 0x40;
        uStack_120 = 0xf6b3d2;
        memset((void *)outArgs.Info,0,0x40);
        __s = (Type)&local_118;
      }
      else {
        uStack_120 = 0xf6b340;
        this_00 = ScriptContext::GetThreadContext(*(ScriptContext **)(local_f8 + 0x78));
        uStack_120 = 0xf6b368;
        ThreadContext::ProbeStack
                  (this_00,(ulong)(local_60._0_4_ & 0xffffff) * 8 + 0xc00,
                   *(ScriptContext **)(local_f8 + 0x78),(PVOID)0x0);
        __n = (ulong)((local_60._0_4_ & 0xffffff) << 3);
        lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
        __s = (Type)((long)&local_118 + lVar2);
        local_c0 = __n;
        outArgs.Info = __s;
        *(undefined8 *)((long)&uStack_120 + lVar2) = 0xf6b3a8;
        memset((void *)__s,0,__n);
      }
      *(undefined8 *)((long)__s + -8) = 0xf6b3e2;
      Arguments::Arguments(&local_d0,(Arguments *)local_30);
      spreadIndices_00 = args.Values;
      scriptContext = *(ScriptContext **)(local_f8 + 0x78);
      *(undefined8 *)((long)__s + -8) = 0xf6b401;
      JavascriptFunction::SpreadArgs
                (&local_d0,(Arguments *)local_60,(AuxArray<unsigned_int> *)spreadIndices_00,
                 scriptContext);
      pIVar3 = local_f8;
      local_fc = (uint)playout->Return;
      localRegisterID = playout->Function;
      *(undefined8 *)((long)__s + -8) = 0xf6b423;
      local_108 = GetReg<unsigned_short>(pIVar3,localRegisterID);
      *(undefined8 *)((long)__s + -8) = 0xf6b43a;
      Arguments::Arguments(&local_e0,(Arguments *)local_60);
      pvVar5 = local_108;
      caller = *(ScriptFunction **)(local_f8 + 0x80);
      profileId = *(ProfileId *)(playout + 1);
      arrayProfileId = *(ProfileId *)((long)&playout[1].Return + 1);
      *(undefined8 *)((long)__s + -8) = 0xf6b46f;
      pvVar5 = ProfilingHelpers::ProfiledNewScObjArray
                         (pvVar5,&local_e0,caller,profileId,arrayProfileId);
      pIVar3 = local_f8;
      localRegisterID_00 = local_fc;
      *(undefined8 *)((long)__s + -8) = 0xf6b484;
      SetReg<unsigned_int>(pIVar3,localRegisterID_00,pvVar5);
    }
    pIVar3 = local_f8;
    bVar1 = playout->ArgCount;
    *(undefined8 *)((long)__s + -8) = 0xf6b522;
    PopOut(pIVar3,(ushort)bVar1);
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledNewScObjArray_Impl(const unaligned T* playout, const Js::AuxArray<uint32> *spreadIndices)
    {
        // Always profile this operation when auto-profiling so that array type changes are tracked
#if ENABLE_PROFILE_INFO
        if (!Profiled && !isAutoProfiling)
#else
        Assert(!Profiled);
#endif
        {
            OP_NewScObjArray_Impl<T, Profiled>(playout, spreadIndices);
            return;
        }

#if ENABLE_PROFILE_INFO
        Arguments args(CallInfo(CallFlags_New, playout->ArgCount), m_outParams);

        uint32 spreadSize = 0;
        if (spreadIndices != nullptr)
        {
            spreadSize = JavascriptFunction::GetSpreadSize(args, spreadIndices, scriptContext);

            // Allocate room on the stack for the spread args.
            Arguments outArgs(CallInfo(CallFlags_New, 0), nullptr);
            outArgs.Info.Count = spreadSize;
            const unsigned STACK_ARGS_ALLOCA_THRESHOLD = 8; // Number of stack args we allow before using _alloca
            Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
            size_t outArgsSize = 0;
            if (outArgs.Info.Count > STACK_ARGS_ALLOCA_THRESHOLD)
            {
                PROBE_STACK(scriptContext, outArgs.Info.Count * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
                outArgsSize = outArgs.Info.Count * sizeof(Var);
                outArgs.Values = (Var*)_alloca(outArgsSize);
                ZeroMemory(outArgs.Values, outArgsSize);
            }
            else
            {
                outArgs.Values = stackArgs;
                outArgsSize = STACK_ARGS_ALLOCA_THRESHOLD * sizeof(Var);
                ZeroMemory(outArgs.Values, outArgsSize); // We may not use all of the elements
            }
            JavascriptFunction::SpreadArgs(args, outArgs, spreadIndices, scriptContext);

            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    outArgs,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        else
        {
            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    args,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        PopOut(playout->ArgCount);
#endif
    }